

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::ThriftSender_testExceptions_Test::~ThriftSender_testExceptions_Test
          (ThriftSender_testExceptions_Test *this)

{
  ThriftSender_testExceptions_Test *this_local;
  
  ~ThriftSender_testExceptions_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ThriftSender, testExceptions)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    Span span(tracer);
    span.SetOperationName("test");

    const MockUDPSender::ExceptionType exceptionTypes[] = {
        MockUDPSender::ExceptionType::kSystemError,
        MockUDPSender::ExceptionType::kException,
        MockUDPSender::ExceptionType::kString
    };
    for (auto type : exceptionTypes) {
      MockThriftSender mockSender(net::IPAddress::v4("localhost", 0), 0, type);
      mockSender.append(span);
        ASSERT_THROW(mockSender.flush(), Sender::Exception);
    }
}